

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool __thiscall inja::Parser::parse_statement(Parser *this,Template *tmpl,Kind closing,path *path)

{
  Token *this_00;
  string_view *__t;
  BlockNode **__args_1;
  IfStatementNode *pIVar1;
  IfStatementNode **ppIVar2;
  char *pcVar3;
  BlockNode *pBVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  shared_ptr<inja::ForStatementNode> *psVar5;
  bool bVar6;
  _Elt_pointer ppBVar7;
  _Elt_pointer ppIVar8;
  _Elt_pointer ppFVar9;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_bool>
  pVar10;
  shared_ptr<inja::IfStatementNode> if_statement_node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Token key_token;
  allocator<char> local_7a;
  allocator<char> local_79;
  shared_ptr<inja::ForStatementNode> for_statement_node;
  shared_ptr<inja::BlockStatementNode> block_statement_node;
  __shared_ptr<inja::ForObjectStatementNode,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined8 local_38;
  
  if ((this->tok).kind == Id) {
    __x._M_len = (this->tok).text._M_len;
    __x._M_str = (this->tok).text._M_str;
    __y._M_str = "if";
    __y._M_len = 2;
    bVar6 = ::std::operator==(__x,__y);
    if (bVar6) {
      get_next_token(this);
      local_c8._M_dataplus._M_p = (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
      ::std::make_shared<inja::IfStatementNode,inja::BlockNode*&,long>
                ((BlockNode **)&if_statement_node,(long *)&this->current_block);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::IfStatementNode>&>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&this->current_block->nodes,&if_statement_node);
      local_c8._M_dataplus._M_p =
           (pointer)if_statement_node.
                    super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>::
      emplace_back<inja::IfStatementNode*>
                ((deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>> *)
                 &this->if_statement_stack,(IfStatementNode **)&local_c8);
      this->current_block =
           &(if_statement_node.super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->true_statement;
      this->current_expression_list =
           &(if_statement_node.super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->condition;
      bVar6 = parse_expression(this,tmpl,closing);
LAB_001234e3:
      psVar5 = (shared_ptr<inja::ForStatementNode> *)&if_statement_node;
LAB_001234ea:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&((__shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2> *)
                  &psVar5->super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>)->
                  _M_refcount);
LAB_001234ef:
      if (bVar6 == false) goto LAB_001234f7;
    }
    else {
      __x_00._M_len = (this->tok).text._M_len;
      __x_00._M_str = (this->tok).text._M_str;
      __y_00._M_str = "else";
      __y_00._M_len = 4;
      bVar6 = ::std::operator==(__x_00,__y_00);
      if (bVar6) {
        ppIVar8 = (this->if_statement_stack).c.
                  super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppIVar8 ==
            (this->if_statement_stack).c.
            super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&if_statement_node,"else without matching if",
                     (allocator<char> *)&local_c8);
          throw_parser_error(this,(string *)&if_statement_node);
          ::std::__cxx11::string::~string((string *)&if_statement_node);
          ppIVar8 = (this->if_statement_stack).c.
                    super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        if (ppIVar8 ==
            (this->if_statement_stack).c.
            super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppIVar8 = (this->if_statement_stack).c.
                    super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        get_next_token(this);
        pIVar1 = ppIVar8[-1];
        pIVar1->has_false_statement = true;
        this->current_block = &pIVar1->false_statement;
        if (((this->tok).kind == Id) &&
           (__x_01._M_len = (this->tok).text._M_len, __x_01._M_str = (this->tok).text._M_str,
           __y_01._M_str = "if", __y_01._M_len = 2, bVar6 = ::std::operator==(__x_01,__y_01), bVar6)
           ) {
          get_next_token(this);
          key_token.kind._0_1_ = 1;
          local_c8._M_dataplus._M_p =
               (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
          ::std::make_shared<inja::IfStatementNode,bool,inja::BlockNode*&,long>
                    ((bool *)&if_statement_node,(BlockNode **)&key_token,
                     (long *)&this->current_block);
          ::std::
          vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
          emplace_back<std::shared_ptr<inja::IfStatementNode>&>
                    ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                      *)&this->current_block->nodes,&if_statement_node);
          local_c8._M_dataplus._M_p =
               (pointer)if_statement_node.
                        super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          ::std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>::
          emplace_back<inja::IfStatementNode*>
                    ((deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>> *)
                     &this->if_statement_stack,(IfStatementNode **)&local_c8);
          this->current_block =
               &(if_statement_node.
                 super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                true_statement;
          this->current_expression_list =
               &(if_statement_node.
                 super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                condition;
          bVar6 = parse_expression(this,tmpl,closing);
          goto LAB_001234e3;
        }
      }
      else {
        __x_02._M_len = (this->tok).text._M_len;
        __x_02._M_str = (this->tok).text._M_str;
        __y_02._M_str = "endif";
        __y_02._M_len = 5;
        bVar6 = ::std::operator==(__x_02,__y_02);
        if (bVar6) {
          if ((this->if_statement_stack).c.
              super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->if_statement_stack).c.
              super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur) {
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&if_statement_node,"endif without matching if",
                       (allocator<char> *)&local_c8);
            throw_parser_error(this,(string *)&if_statement_node);
            ::std::__cxx11::string::~string((string *)&if_statement_node);
          }
LAB_001236a5:
          ppIVar8 = (this->if_statement_stack).c.
                    super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppIVar8 !=
              (this->if_statement_stack).c.
              super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            if (ppIVar8[-1]->is_nested != true) goto LAB_00123927;
LAB_001236e6:
            std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::pop_back
                      (&(this->if_statement_stack).c);
            goto LAB_001236a5;
          }
          ppIVar2 = (this->if_statement_stack).c.
                    super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppIVar2[0x3f]->is_nested != false) goto LAB_001236e6;
          ppIVar8 = ppIVar2 + 0x40;
LAB_00123927:
          get_next_token(this);
          this->current_block = ppIVar8[-1]->parent;
          std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::pop_back
                    (&(this->if_statement_stack).c);
        }
        else {
          this_00 = &this->tok;
          __t = &(this->tok).text;
          __x_03._M_len = (this->tok).text._M_len;
          __x_03._M_str = (this->tok).text._M_str;
          __y_03._M_str = "block";
          __y_03._M_len = 5;
          bVar6 = ::std::operator==(__x_03,__y_03);
          if (bVar6) {
            get_next_token(this);
            if ((this->tok).kind != Id) {
              Token::describe_abi_cxx11_((string *)&key_token,this_00);
              ::std::operator+(&local_c8,"expected block name, got \'",(string *)&key_token);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &if_statement_node,&local_c8,"\'");
              throw_parser_error(this,(string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&local_c8);
              ::std::__cxx11::string::~string((string *)&key_token);
            }
            ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&if_statement_node,__t,(allocator<char> *)&local_c8);
            __args_1 = &this->current_block;
            local_c8._M_dataplus._M_p =
                 (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
            ::std::
            make_shared<inja::BlockStatementNode,inja::BlockNode*&,std::__cxx11::string_const&,long>
                      ((BlockNode **)&block_statement_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1
                       ,(long *)&if_statement_node);
            ::std::
            vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
            emplace_back<std::shared_ptr<inja::BlockStatementNode>&>
                      ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                        *)&(*__args_1)->nodes,&block_statement_node);
            local_c8._M_dataplus._M_p =
                 (pointer)block_statement_node.
                          super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
            ::std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>::
            emplace_back<inja::BlockStatementNode*>
                      ((deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>> *
                       )&this->block_statement_stack,(BlockStatementNode **)&local_c8);
            *__args_1 = &(block_statement_node.
                          super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->block;
            pVar10 = ::std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
                     ::
                     _M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<inja::BlockStatementNode>&>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
                                 *)&tmpl->block_storage,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&if_statement_node,&block_statement_node);
            if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &key_token,"block with the name \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &if_statement_node);
              ::std::operator+(&local_c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &key_token,"\' does already exist");
              throw_parser_error(this,&local_c8);
              ::std::__cxx11::string::~string((string *)&local_c8);
              ::std::__cxx11::string::~string((string *)&key_token);
            }
            get_next_token(this);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&block_statement_node.
                        super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_00123874;
          }
          __x_04._M_len = (this->tok).text._M_len;
          __x_04._M_str = (this->tok).text._M_str;
          __y_04._M_str = "endblock";
          __y_04._M_len = 8;
          bVar6 = ::std::operator==(__x_04,__y_04);
          if (bVar6) {
            ppBVar7 = (this->block_statement_stack).c.
                      super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (ppBVar7 ==
                (this->block_statement_stack).c.
                super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&if_statement_node,"endblock without matching block",
                         (allocator<char> *)&local_c8);
              throw_parser_error(this,(string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&if_statement_node);
              ppBVar7 = (this->block_statement_stack).c.
                        super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            }
            if (ppBVar7 ==
                (this->block_statement_stack).c.
                super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppBVar7 = (this->block_statement_stack).c.
                        super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            get_next_token(this);
            this->current_block = ppBVar7[-1]->parent;
            std::deque<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>::
            pop_back(&(this->block_statement_stack).c);
            goto LAB_00123949;
          }
          __x_05._M_len = (this->tok).text._M_len;
          __x_05._M_str = (this->tok).text._M_str;
          __y_05._M_str = "for";
          __y_05._M_len = 3;
          bVar6 = ::std::operator==(__x_05,__y_05);
          if (bVar6) {
            get_next_token(this);
            if ((this->tok).kind != Id) {
              Token::describe_abi_cxx11_((string *)&key_token,this_00);
              ::std::operator+(&local_c8,"expected id, got \'",(string *)&key_token);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &if_statement_node,&local_c8,"\'");
              throw_parser_error(this,(string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&local_c8);
              ::std::__cxx11::string::~string((string *)&key_token);
            }
            pcVar3 = (this->tok).text._M_str;
            block_statement_node.
            super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)this_00;
            block_statement_node.
            super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->tok).text._M_len;
            get_next_token(this);
            for_statement_node.
            super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            for_statement_node.
            super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((this->tok).kind == Comma) {
              get_next_token(this);
              if (this_00->kind != Id) {
                Token::describe_abi_cxx11_((string *)&key_token,this_00);
                ::std::operator+(&local_c8,"expected id, got \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&key_token);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&if_statement_node,&local_c8,"\'");
                throw_parser_error(this,(string *)&if_statement_node);
                ::std::__cxx11::string::~string((string *)&if_statement_node);
                ::std::__cxx11::string::~string((string *)&local_c8);
                ::std::__cxx11::string::~string((string *)&key_token);
              }
              key_token._0_8_ =
                   block_statement_node.
                   super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              key_token.text._M_len =
                   (size_t)block_statement_node.
                           super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
              block_statement_node.
              super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)this_00;
              block_statement_node.
              super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->tok).text._M_len;
              key_token.text._M_str = pcVar3;
              get_next_token(this);
              ::std::__cxx11::string::
              string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&if_statement_node,&key_token.text,&local_79);
              ::std::__cxx11::string::
              string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&local_c8,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         &block_statement_node.
                          super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_7a);
              local_38 = (long)(this->tok).text._M_str - (long)(tmpl->content)._M_dataplus._M_p;
              ::std::
              make_shared<inja::ForObjectStatementNode,std::__cxx11::string,std::__cxx11::string,inja::BlockNode*&,long>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_48,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &if_statement_node,(BlockNode **)&local_c8,(long *)&this->current_block);
              ::std::__shared_ptr<inja::ForStatementNode,(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<inja::ForStatementNode,(__gnu_cxx::_Lock_policy)2> *)
                         &for_statement_node,&local_48);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_48._M_refcount);
              ::std::__cxx11::string::~string((string *)&local_c8);
            }
            else {
              ::std::__cxx11::string::
              string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&if_statement_node,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         &block_statement_node.
                          super___shared_ptr<inja::BlockStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(allocator<char> *)&local_48);
              key_token._0_8_ =
                   (long)(this->tok).text._M_str - (long)(tmpl->content)._M_dataplus._M_p;
              ::std::
              make_shared<inja::ForArrayStatementNode,std::__cxx11::string,inja::BlockNode*&,long>
                        (&local_c8,(BlockNode **)&if_statement_node,(long *)&this->current_block);
              ::std::__shared_ptr<inja::ForStatementNode,(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<inja::ForStatementNode,(__gnu_cxx::_Lock_policy)2> *)
                         &for_statement_node,
                         (__shared_ptr<inja::ForArrayStatementNode,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_c8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
            }
            ::std::__cxx11::string::~string((string *)&if_statement_node);
            ::std::
            vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
            emplace_back<std::shared_ptr<inja::ForStatementNode>&>
                      ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                        *)&this->current_block->nodes,&for_statement_node);
            if_statement_node.super___shared_ptr<inja::IfStatementNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     for_statement_node.
                     super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            ::std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>::
            emplace_back<inja::ForStatementNode*>
                      ((deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>> *)
                       &this->for_statement_stack,(ForStatementNode **)&if_statement_node);
            this->current_block =
                 &(for_statement_node.
                   super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  body;
            this->current_expression_list =
                 &(for_statement_node.
                   super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  condition;
            if (((this->tok).kind != Id) ||
               (__x_08._M_len = (this->tok).text._M_len, __x_08._M_str = (this->tok).text._M_str,
               __y_08._M_str = "in", __y_08._M_len = 2, bVar6 = ::std::operator!=(__x_08,__y_08),
               bVar6)) {
              Token::describe_abi_cxx11_((string *)&key_token,this_00);
              ::std::operator+(&local_c8,"expected \'in\', got \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &key_token);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &if_statement_node,&local_c8,"\'");
              throw_parser_error(this,(string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&local_c8);
              ::std::__cxx11::string::~string((string *)&key_token);
            }
            get_next_token(this);
            bVar6 = parse_expression(this,tmpl,closing);
            psVar5 = &for_statement_node;
            goto LAB_001234ea;
          }
          __x_06._M_len = (this->tok).text._M_len;
          __x_06._M_str = (this->tok).text._M_str;
          __y_06._M_str = "endfor";
          __y_06._M_len = 6;
          bVar6 = ::std::operator==(__x_06,__y_06);
          if (bVar6) {
            ppFVar9 = (this->for_statement_stack).c.
                      super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (ppFVar9 ==
                (this->for_statement_stack).c.
                super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&if_statement_node,"endfor without matching for",
                         (allocator<char> *)&local_c8);
              throw_parser_error(this,(string *)&if_statement_node);
              ::std::__cxx11::string::~string((string *)&if_statement_node);
              ppFVar9 = (this->for_statement_stack).c.
                        super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            }
            if (ppFVar9 ==
                (this->for_statement_stack).c.
                super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppFVar9 = (this->for_statement_stack).c.
                        super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            get_next_token(this);
            this->current_block = ppFVar9[-1]->parent;
            std::deque<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>::
            pop_back(&(this->for_statement_stack).c);
            goto LAB_00123949;
          }
          __x_07._M_len = (this->tok).text._M_len;
          __x_07._M_str = (this->tok).text._M_str;
          __y_07._M_str = "include";
          __y_07._M_len = 7;
          bVar6 = ::std::operator==(__x_07,__y_07);
          if (bVar6) {
            get_next_token(this);
            parse_filename_abi_cxx11_((string *)&if_statement_node,this);
            add_to_template_storage(this,path,(string *)&if_statement_node);
            pBVar4 = this->current_block;
            key_token._0_8_ = (long)(this->tok).text._M_str - (long)(tmpl->content)._M_dataplus._M_p
            ;
            ::std::make_shared<inja::IncludeStatementNode,std::__cxx11::string&,long>
                      (&local_c8,(long *)&if_statement_node);
            ::std::
            vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
            emplace_back<std::shared_ptr<inja::IncludeStatementNode>>
                      ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                        *)&pBVar4->nodes,(shared_ptr<inja::IncludeStatementNode> *)&local_c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
            get_next_token(this);
          }
          else {
            __x_09._M_len = (this->tok).text._M_len;
            __x_09._M_str = (this->tok).text._M_str;
            __y_09._M_str = "extends";
            __y_09._M_len = 7;
            bVar6 = ::std::operator==(__x_09,__y_09);
            if (!bVar6) {
              __x_10._M_len = (this->tok).text._M_len;
              __x_10._M_str = (this->tok).text._M_str;
              __y_10._M_str = "set";
              __y_10._M_len = 3;
              bVar6 = ::std::operator==(__x_10,__y_10);
              if (!bVar6) goto LAB_001234f7;
              get_next_token(this);
              if ((this->tok).kind != Id) {
                Token::describe_abi_cxx11_((string *)&key_token,this_00);
                ::std::operator+(&local_c8,"expected variable name, got \'",(string *)&key_token);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&if_statement_node,&local_c8,"\'");
                throw_parser_error(this,(string *)&if_statement_node);
                ::std::__cxx11::string::~string((string *)&if_statement_node);
                ::std::__cxx11::string::~string((string *)&local_c8);
                ::std::__cxx11::string::~string((string *)&key_token);
              }
              ::std::__cxx11::string::
              string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&if_statement_node,__t,(allocator<char> *)&local_c8);
              get_next_token(this);
              local_c8._M_dataplus._M_p =
                   (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
              ::std::make_shared<inja::SetStatementNode,std::__cxx11::string_const&,long>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &for_statement_node,(long *)&if_statement_node);
              ::std::
              vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
              ::emplace_back<std::shared_ptr<inja::SetStatementNode>&>
                        ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                          *)&this->current_block->nodes,
                         (shared_ptr<inja::SetStatementNode> *)&for_statement_node);
              this->current_expression_list =
                   (ExpressionListNode *)
                   &(for_statement_node.
                     super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->body;
              __x_11._M_len = (this->tok).text._M_len;
              __x_11._M_str = (this->tok).text._M_str;
              __y_11._M_str = "=";
              __y_11._M_len = 1;
              bVar6 = ::std::operator!=(__x_11,__y_11);
              if (bVar6) {
                Token::describe_abi_cxx11_((string *)&block_statement_node,this_00);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&key_token,"expected \'=\', got \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&block_statement_node);
                ::std::operator+(&local_c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&key_token,"\'");
                throw_parser_error(this,&local_c8);
                ::std::__cxx11::string::~string((string *)&local_c8);
                ::std::__cxx11::string::~string((string *)&key_token);
                ::std::__cxx11::string::~string((string *)&block_statement_node);
              }
              get_next_token(this);
              bVar6 = parse_expression(this,tmpl,closing);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&for_statement_node.
                          super___shared_ptr<inja::ForStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              ::std::__cxx11::string::~string((string *)&if_statement_node);
              goto LAB_001234ef;
            }
            get_next_token(this);
            parse_filename_abi_cxx11_((string *)&if_statement_node,this);
            add_to_template_storage(this,path,(string *)&if_statement_node);
            pBVar4 = this->current_block;
            key_token._0_8_ = (long)(this->tok).text._M_str - (long)(tmpl->content)._M_dataplus._M_p
            ;
            ::std::make_shared<inja::ExtendsStatementNode,std::__cxx11::string&,long>
                      (&local_c8,(long *)&if_statement_node);
            ::std::
            vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
            emplace_back<std::shared_ptr<inja::ExtendsStatementNode>>
                      ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                        *)&pBVar4->nodes,(shared_ptr<inja::ExtendsStatementNode> *)&local_c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
            get_next_token(this);
          }
LAB_00123874:
          ::std::__cxx11::string::~string((string *)&if_statement_node);
        }
      }
    }
LAB_00123949:
    bVar6 = true;
  }
  else {
LAB_001234f7:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool parse_statement(Template& tmpl, Token::Kind closing, const std::filesystem::path& path) {
    if (tok.kind != Token::Kind::Id) {
      return false;
    }

    if (tok.text == static_cast<decltype(tok.text)>("if")) {
      get_next_token();

      auto if_statement_node = std::make_shared<IfStatementNode>(current_block, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(if_statement_node);
      if_statement_stack.emplace(if_statement_node.get());
      current_block = &if_statement_node->true_statement;
      current_expression_list = &if_statement_node->condition;

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("else")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("else without matching if");
      }
      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      if_statement_data->has_false_statement = true;
      current_block = &if_statement_data->false_statement;

      // Chained else if
      if (tok.kind == Token::Kind::Id && tok.text == static_cast<decltype(tok.text)>("if")) {
        get_next_token();

        auto if_statement_node = std::make_shared<IfStatementNode>(true, current_block, tok.text.data() - tmpl.content.c_str());
        current_block->nodes.emplace_back(if_statement_node);
        if_statement_stack.emplace(if_statement_node.get());
        current_block = &if_statement_node->true_statement;
        current_expression_list = &if_statement_node->condition;

        if (!parse_expression(tmpl, closing)) {
          return false;
        }
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endif")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("endif without matching if");
      }

      // Nested if statements
      while (if_statement_stack.top()->is_nested) {
        if_statement_stack.pop();
      }

      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      current_block = if_statement_data->parent;
      if_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("block")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected block name, got '" + tok.describe() + "'");
      }

      const std::string block_name = static_cast<std::string>(tok.text);

      auto block_statement_node = std::make_shared<BlockStatementNode>(current_block, block_name, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(block_statement_node);
      block_statement_stack.emplace(block_statement_node.get());
      current_block = &block_statement_node->block;
      auto success = tmpl.block_storage.emplace(block_name, block_statement_node);
      if (!success.second) {
        throw_parser_error("block with the name '" + block_name + "' does already exist");
      }

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("endblock")) {
      if (block_statement_stack.empty()) {
        throw_parser_error("endblock without matching block");
      }

      auto& block_statement_data = block_statement_stack.top();
      get_next_token();

      current_block = block_statement_data->parent;
      block_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("for")) {
      get_next_token();

      // options: for a in arr; for a, b in obj
      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected id, got '" + tok.describe() + "'");
      }

      Token value_token = tok;
      get_next_token();

      // Object type
      std::shared_ptr<ForStatementNode> for_statement_node;
      if (tok.kind == Token::Kind::Comma) {
        get_next_token();
        if (tok.kind != Token::Kind::Id) {
          throw_parser_error("expected id, got '" + tok.describe() + "'");
        }

        const Token key_token = std::move(value_token);
        value_token = tok;
        get_next_token();

        for_statement_node = std::make_shared<ForObjectStatementNode>(static_cast<std::string>(key_token.text), static_cast<std::string>(value_token.text),
                                                                      current_block, tok.text.data() - tmpl.content.c_str());

        // Array type
      } else {
        for_statement_node =
            std::make_shared<ForArrayStatementNode>(static_cast<std::string>(value_token.text), current_block, tok.text.data() - tmpl.content.c_str());
      }

      current_block->nodes.emplace_back(for_statement_node);
      for_statement_stack.emplace(for_statement_node.get());
      current_block = &for_statement_node->body;
      current_expression_list = &for_statement_node->condition;

      if (tok.kind != Token::Kind::Id || tok.text != static_cast<decltype(tok.text)>("in")) {
        throw_parser_error("expected 'in', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endfor")) {
      if (for_statement_stack.empty()) {
        throw_parser_error("endfor without matching for");
      }

      auto& for_statement_data = for_statement_stack.top();
      get_next_token();

      current_block = for_statement_data->parent;
      for_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("include")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<IncludeStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("extends")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<ExtendsStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("set")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected variable name, got '" + tok.describe() + "'");
      }

      const std::string key = static_cast<std::string>(tok.text);
      get_next_token();

      auto set_statement_node = std::make_shared<SetStatementNode>(key, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(set_statement_node);
      current_expression_list = &set_statement_node->expression;

      if (tok.text != static_cast<decltype(tok.text)>("=")) {
        throw_parser_error("expected '=', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else {
      return false;
    }
    return true;
  }